

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_flush_chain(cw_out_ctx *ctx,Curl_easy *data,cw_out_buf **pcwbuf,_Bool flush_all)

{
  cw_out_buf *cwbuf_00;
  CURLcode CVar1;
  size_t sVar2;
  cw_out_buf *local_48;
  cw_out_buf **plast;
  CURLcode result;
  cw_out_buf *cwbuf;
  _Bool flush_all_local;
  cw_out_buf **pcwbuf_local;
  Curl_easy *data_local;
  cw_out_ctx *ctx_local;
  
  cwbuf_00 = *pcwbuf;
  if ((cwbuf_00 != (cw_out_buf *)0x0) && ((ctx->field_0x28 & 1) == 0)) {
    do {
      local_48 = cwbuf_00;
      if (cwbuf_00->next == (cw_out_buf *)0x0) {
        CVar1 = cw_out_buf_flush(ctx,data,cwbuf_00,flush_all);
        if (CVar1 == CURLE_OK) {
          sVar2 = Curl_dyn_len(&cwbuf_00->b);
          if (sVar2 == 0) {
            cw_out_buf_free(cwbuf_00);
            *pcwbuf = (cw_out_buf *)0x0;
          }
          return CURLE_OK;
        }
        return CVar1;
      }
      while (local_48->next->next != (cw_out_buf *)0x0) {
        local_48 = local_48->next;
      }
      CVar1 = cw_out_flush_chain(ctx,data,&local_48->next,flush_all);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    } while (local_48->next == (cw_out_buf *)0x0);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cw_out_flush_chain(struct cw_out_ctx *ctx,
                                   struct Curl_easy *data,
                                   struct cw_out_buf **pcwbuf,
                                   bool flush_all)
{
  struct cw_out_buf *cwbuf = *pcwbuf;
  CURLcode result;

  if(!cwbuf)
    return CURLE_OK;
  if(ctx->paused)
    return CURLE_OK;

  /* write the end of the chain until it blocks or gets empty */
  while(cwbuf->next) {
    struct cw_out_buf **plast = &cwbuf->next;
    while((*plast)->next)
      plast = &(*plast)->next;
    result = cw_out_flush_chain(ctx, data, plast, flush_all);
    if(result)
      return result;
    if(*plast) {
      /* could not write last, paused again? */
      DEBUGASSERT(ctx->paused);
      return CURLE_OK;
    }
  }

  result = cw_out_buf_flush(ctx, data, cwbuf, flush_all);
  if(result)
    return result;
  if(!Curl_dyn_len(&cwbuf->b)) {
    cw_out_buf_free(cwbuf);
    *pcwbuf = NULL;
  }
  return CURLE_OK;
}